

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * Cudd_Xgty(DdManager *dd,int N,DdNode **z,DdNode **x,DdNode **y)

{
  DdNode *n;
  DdNode *h;
  int local_54;
  int i;
  DdNode *w;
  DdNode *v;
  DdNode *u;
  DdNode **y_local;
  DdNode **x_local;
  DdNode **z_local;
  int N_local;
  DdManager *dd_local;
  
  v = Cudd_bddAnd(dd,x[N + -1],(DdNode *)((ulong)y[N + -1] ^ 1));
  if (v == (DdNode *)0x0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + 1;
    for (local_54 = N + -2; -1 < local_54; local_54 = local_54 + -1) {
      n = Cudd_bddAnd(dd,y[local_54],(DdNode *)((ulong)v ^ 1));
      if (n == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,v);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) + 1;
      h = Cudd_bddAnd(dd,(DdNode *)((ulong)y[local_54] ^ 1),v);
      if (h == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,v);
        Cudd_RecursiveDeref(dd,n);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref(dd,v);
      v = Cudd_bddIte(dd,x[local_54],(DdNode *)((ulong)n ^ 1),h);
      if (v == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n);
        Cudd_RecursiveDeref(dd,h);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref(dd,n);
      Cudd_RecursiveDeref(dd,h);
    }
    *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + -1;
    dd_local = (DdManager *)v;
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_Xgty(
  DdManager * dd /* DD manager */,
  int  N /* number of x and y variables */,
  DdNode ** z /* array of z variables: unused */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */)
{
    DdNode *u, *v, *w;
    int     i;

    /* Build bottom part of BDD outside loop. */
    u = Cudd_bddAnd(dd, x[N-1], Cudd_Not(y[N-1]));
    if (u == NULL) return(NULL);
    cuddRef(u);

    /* Loop to build the rest of the BDD. */
    for (i = N-2; i >= 0; i--) {
        v = Cudd_bddAnd(dd, y[i], Cudd_Not(u));
        if (v == NULL) {
            Cudd_RecursiveDeref(dd, u);
            return(NULL);
        }
        cuddRef(v);
        w = Cudd_bddAnd(dd, Cudd_Not(y[i]), u);
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, u);
            Cudd_RecursiveDeref(dd, v);
            return(NULL);
        }
        cuddRef(w);
        Cudd_RecursiveDeref(dd, u);
        u = Cudd_bddIte(dd, x[i], Cudd_Not(v), w);
        if (u == NULL) {
            Cudd_RecursiveDeref(dd, v);
            Cudd_RecursiveDeref(dd, w);
            return(NULL);
        }
        cuddRef(u);
        Cudd_RecursiveDeref(dd, v);
        Cudd_RecursiveDeref(dd, w);

    }
    cuddDeref(u);
    return(u);

}